

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

void __thiscall LinkedObjectFile::find_code(LinkedObjectFile *this)

{
  uint32_t *puVar1;
  long lVar2;
  pointer pLVar3;
  pointer pLVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  pointer pvVar8;
  ulong uVar9;
  pointer puVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  ulong uVar14;
  bool bVar15;
  size_t j;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  string *psVar19;
  pointer pLVar20;
  
  iVar6 = this->segments;
  if (iVar6 != 0) {
    if (iVar6 == 1) {
      pvVar8 = (this->words_by_seg).
               super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar4 = *(pointer *)
                ((long)&(pvVar8->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                        _M_impl.super__Vector_impl_data + 8);
      pLVar20 = (pvVar8->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl.
                super__Vector_impl_data._M_start;
      while (pLVar20 != pLVar4) {
        psVar19 = (string *)((long)pLVar20 + 0x10);
        if ((psVar19->_M_string_length != 0) &&
           (iVar6 = std::__cxx11::string::compare((char *)psVar19), iVar6 == 0)) {
          __assert_fail("word.symbol_name != \"function\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                        ,0x122,"void LinkedObjectFile::find_code()");
        }
        pLVar20 = (pointer)(psVar19 + 1);
      }
      puVar10 = (this->offset_of_data_zone_by_seg).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->offset_of_data_zone_by_seg).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar10) {
        uVar11 = 0;
        uVar14 = 0;
LAB_0012f6f4:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar14,uVar11);
      }
      *puVar10 = 0;
      pvVar8 = (this->words_by_seg).
               super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->stats).data_bytes =
           (int)((ulong)((long)*(pointer *)
                                ((long)&(pvVar8->
                                        super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)
                                        ._M_impl.super__Vector_impl_data + 8) -
                        *(long *)&(pvVar8->
                                  super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                                  _M_impl.super__Vector_impl_data) >> 4) * -0x55555554;
      (this->stats).code_bytes = 0;
    }
    else {
      if (iVar6 != 3) {
        __assert_fail("segments == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                      ,0x167,"void LinkedObjectFile::find_code()");
      }
      if (0 < this->segments) {
        uVar18 = 0;
        do {
          pvVar8 = (this->words_by_seg).
                   super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = ((long)(this->words_by_seg).
                          super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                   -0x5555555555555555;
          uVar14 = uVar18;
          if (uVar11 < uVar18 || uVar11 - uVar18 == 0) goto LAB_0012f6f4;
          lVar12 = (long)*(pointer *)
                          ((long)&pvVar8[uVar18].
                                  super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                  _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&pvVar8[uVar18].
                             super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                             super__Vector_impl_data;
          uVar17 = (lVar12 >> 4) * -0x5555555555555555;
          uVar16 = 0xffffffffffffffff;
          bVar15 = false;
          do {
            uVar17 = uVar17 - 1;
            lVar12 = lVar12 + -0x30;
            if (uVar17 == 0xffffffffffffffff) break;
            pvVar8 = (this->words_by_seg).
                     super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = ((long)(this->words_by_seg).
                            super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                     -0x5555555555555555;
            uVar14 = uVar18;
            if (uVar11 < uVar18 || uVar11 - uVar18 == 0) goto LAB_0012f6f4;
            lVar2 = *(long *)&pvVar8[uVar18].
                              super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                              super__Vector_impl_data;
            uVar11 = ((long)*(pointer *)
                             ((long)&pvVar8[uVar18].
                                     super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                     _M_impl.super__Vector_impl_data + 8) - lVar2 >> 4) *
                     -0x5555555555555555;
            uVar14 = uVar17;
            if (uVar11 < uVar17 || uVar11 - uVar17 == 0) goto LAB_0012f6f4;
            if ((*(int *)(lVar2 + lVar12) == 7) &&
               (iVar6 = std::__cxx11::string::compare((char *)(lVar2 + lVar12 + 0x10)), iVar6 == 0))
            {
              bVar15 = true;
              bVar5 = false;
              uVar16 = uVar17;
            }
            else {
              bVar5 = true;
            }
          } while (bVar5);
          if (bVar15) {
            pvVar8 = (this->words_by_seg).
                     super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = ((long)(this->words_by_seg).
                            super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                     -0x5555555555555555;
            uVar14 = uVar18;
            if (uVar11 < uVar18 || uVar11 - uVar18 == 0) goto LAB_0012f6f4;
            lVar12 = *(long *)&pvVar8[uVar18].
                               super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                               super__Vector_impl_data;
            uVar9 = ((long)*(pointer *)
                            ((long)&pvVar8[uVar18].
                                    super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                    _M_impl.super__Vector_impl_data + 8) - lVar12 >> 4) *
                    -0x5555555555555555;
            piVar13 = (int *)(lVar12 + uVar16 * 0x30 + 4);
            uVar17 = 0xffffffffffffffff;
            bVar15 = false;
            while (uVar16 < uVar9) {
              if (*piVar13 == 0x3e00008 && piVar13[-1] == 0) {
                bVar15 = true;
                uVar17 = uVar16;
              }
              uVar16 = uVar16 + 1;
              piVar13 = piVar13 + 0xc;
              if (uVar11 < uVar18 || uVar11 - uVar18 == 0) goto LAB_0012f6f4;
            }
            if (!bVar15) {
              __assert_fail("found_jr_ra",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                            ,0x14a,"void LinkedObjectFile::find_code()");
            }
            if (uVar9 <= uVar17 + 1) {
              __assert_fail("jr_ra_loc + 1 < words_by_seg.at(i).size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                            ,0x14b,"void LinkedObjectFile::find_code()");
            }
            puVar10 = (this->offset_of_data_zone_by_seg).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar11 = (long)(this->offset_of_data_zone_by_seg).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar10 >> 2;
            if (uVar11 <= uVar18) goto LAB_0012f6f4;
            uVar7 = (int)uVar17 + 2;
          }
          else {
            puVar10 = (this->offset_of_data_zone_by_seg).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar11 = (long)(this->offset_of_data_zone_by_seg).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar10 >> 2;
            uVar7 = 0;
            uVar14 = uVar18;
            if (uVar11 <= uVar18) goto LAB_0012f6f4;
          }
          puVar10[uVar18] = uVar7;
          puVar10 = (this->offset_of_data_zone_by_seg).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar11 = (long)(this->offset_of_data_zone_by_seg).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar10 >> 2;
          uVar14 = uVar18;
          if (uVar11 <= uVar18) goto LAB_0012f6f4;
          pvVar8 = (this->words_by_seg).
                   super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = ((long)(this->words_by_seg).
                          super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                   -0x5555555555555555;
          if (uVar11 < uVar18 || uVar11 - uVar18 == 0) goto LAB_0012f6f4;
          uVar7 = puVar10[uVar18];
          uVar14 = ((long)*(pointer *)
                           ((long)&pvVar8[uVar18].
                                   super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                    *(long *)&pvVar8[uVar18].
                              super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                              super__Vector_impl_data >> 4) * -0x5555555555555555;
          if (uVar7 <= uVar14 && uVar14 - uVar7 != 0) {
            iVar6 = get_label_id_for(this,(int)uVar18,uVar7 << 2);
            uVar14 = (ulong)iVar6;
            pLVar3 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar11 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl
                            .super__Vector_impl_data._M_finish - (long)pLVar3 >> 3) *
                     -0x3333333333333333;
            if (uVar11 < uVar14 || uVar11 - uVar14 == 0) goto LAB_0012f6f4;
            pLVar3 = pLVar3 + uVar14;
            std::__cxx11::string::_M_replace
                      ((ulong)pLVar3,0,(char *)(pLVar3->name)._M_string_length,0x14aa5f);
          }
          puVar10 = (this->offset_of_data_zone_by_seg).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar11 = (long)(this->offset_of_data_zone_by_seg).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar10 >> 2;
          uVar14 = uVar18;
          if (uVar11 <= uVar18) goto LAB_0012f6f4;
          pvVar8 = (this->words_by_seg).
                   super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = ((long)(this->words_by_seg).
                          super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                   -0x5555555555555555;
          if (uVar11 < uVar18 || uVar11 - uVar18 == 0) goto LAB_0012f6f4;
          uVar14 = (ulong)puVar10[uVar18];
          uVar16 = uVar14 - 1;
          lVar12 = uVar14 * 0x30 + 0x10;
          while( true ) {
            lVar2 = *(long *)&pvVar8[uVar18].
                              super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                              super__Vector_impl_data;
            uVar17 = ((long)*(pointer *)
                             ((long)&pvVar8[uVar18].
                                     super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                     _M_impl.super__Vector_impl_data + 8) - lVar2 >> 4) *
                     -0x5555555555555555;
            uVar16 = uVar16 + 1;
            if (uVar17 <= uVar16) break;
            if ((*(int *)(lVar2 + -0x10 + lVar12) == 7) &&
               (iVar6 = std::__cxx11::string::compare((char *)(lVar2 + lVar12)), iVar6 == 0)) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                            ,0x15d,"void LinkedObjectFile::find_code()");
            }
            lVar12 = lVar12 + 0x30;
            pvVar8 = (this->words_by_seg).
                     super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = ((long)(this->words_by_seg).
                            super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                     -0x5555555555555555;
            uVar14 = uVar18;
            if (uVar11 < uVar18 || uVar11 - uVar18 == 0) goto LAB_0012f6f4;
          }
          puVar10 = (this->offset_of_data_zone_by_seg).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar11 = (long)(this->offset_of_data_zone_by_seg).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar10 >> 2;
          uVar14 = uVar18;
          if (uVar11 <= uVar18) goto LAB_0012f6f4;
          puVar1 = &(this->stats).data_bytes;
          *puVar1 = *puVar1 + ((int)uVar17 - puVar10[uVar18]) * 0x10;
          puVar1 = &(this->stats).code_bytes;
          *puVar1 = *puVar1 + puVar10[uVar18] * 4;
          uVar18 = uVar18 + 1;
        } while ((long)uVar18 < (long)this->segments);
      }
    }
  }
  return;
}

Assistant:

void LinkedObjectFile::find_code() {
  if (segments == 1) {
    // single segment object files should never have any code.
    auto& seg = words_by_seg.front();
    for (auto& word : seg) {
      if (!word.symbol_name.empty()) {
        assert(word.symbol_name != "function");
      }
    }
    offset_of_data_zone_by_seg.at(0) = 0;
    stats.data_bytes = words_by_seg.front().size() * 4;
    stats.code_bytes = 0;

  } else if (segments == 3) {
    // V3 object files will have all the functions, then all the static data.  So to find the
    // divider, we look for the last "function" tag, then find the last jr $ra instruction after
    // that (plus one for delay slot) and assume that after that is data.  Additionally, we check to
    // make sure that there are no "function" type tags in the data section, although this is
    // redundant.
    for (int i = 0; i < segments; i++) {
      // try to find the last reference to "function":
      bool found_function = false;
      size_t function_loc = -1;
      for (size_t j = words_by_seg.at(i).size(); j-- > 0;) {
        auto& word = words_by_seg.at(i).at(j);
        if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
          function_loc = j;
          found_function = true;
          break;
        }
      }

      if (found_function) {
        // look forward until we find "jr ra"
        const uint32_t jr_ra = 0x3e00008;
        bool found_jr_ra = false;
        size_t jr_ra_loc = -1;

        for (size_t j = function_loc; j < words_by_seg.at(i).size(); j++) {
          auto& word = words_by_seg.at(i).at(j);
          if (word.kind == LinkedWord::PLAIN_DATA && word.data == jr_ra) {
            found_jr_ra = true;
            jr_ra_loc = j;
          }
        }

        assert(found_jr_ra);
        assert(jr_ra_loc + 1 < words_by_seg.at(i).size());
        offset_of_data_zone_by_seg.at(i) = jr_ra_loc + 2;

      } else {
        // no functions
        offset_of_data_zone_by_seg.at(i) = 0;
      }

      // add label for debug purposes
      if (offset_of_data_zone_by_seg.at(i) < words_by_seg.at(i).size()) {
        auto data_label_id = get_label_id_for(i, 4 * (offset_of_data_zone_by_seg.at(i)));
        labels.at(data_label_id).name = "L-data-start";
      }

      // verify there are no functions after the data section starts
      for (size_t j = offset_of_data_zone_by_seg.at(i); j < words_by_seg.at(i).size(); j++) {
        auto& word = words_by_seg.at(i).at(j);
        if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "function") {
          assert(false);
        }
      }

      // sizes:
      stats.data_bytes += 4 * (words_by_seg.at(i).size() - offset_of_data_zone_by_seg.at(i)) * 4;
      stats.code_bytes += 4 * offset_of_data_zone_by_seg.at(i);
    }
  } else {
    // for files which we couldn't extract link data yet, they will have 0 segments and its ok.
    assert(segments == 0);
  }
}